

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureCompletenessTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::Incomplete2DSizeCase::createTexture(Incomplete2DSizeCase *this)

{
  int level;
  bool bVar1;
  int iVar2;
  int iVar3;
  GLenum err;
  deBool dVar4;
  int *piVar5;
  void *pixels;
  MessageBuilder *pMVar6;
  int local_2b4;
  int local_294;
  RGBA local_254;
  MessageBuilder local_250;
  int local_cc;
  int ndx;
  Vector<float,_4> local_a0;
  PixelBufferAccess local_90;
  int local_68;
  int local_64;
  int levelH;
  int levelW;
  int levelNdx;
  int numLevels;
  GLuint texture;
  TestLog *local_48;
  TestLog *log;
  TextureLevel levelData;
  TextureFormat fmt;
  Incomplete2DSizeCase *this_local;
  
  levelData.m_data.m_cap = (size_t)glu::mapGLTransferFormat(0x1908,0x1401);
  tcu::TextureLevel::TextureLevel((TextureLevel *)&log,(TextureFormat *)&levelData.m_data.m_cap);
  local_48 = tcu::TestContext::getLog((this->super_Tex2DCompletenessCase).m_testCtx);
  glwGenTextures(1,(GLuint *)&levelNdx);
  glwPixelStorei(0xcf5,1);
  glwBindTexture(0xde1,levelNdx);
  glwTexParameteri(0xde1,0x2802,0x2901);
  glwTexParameteri(0xde1,0x2803,0x2901);
  glwTexParameteri(0xde1,0x2801,0x2700);
  glwTexParameteri(0xde1,0x2800,0x2600);
  piVar5 = tcu::Vector<int,_2>::x(&this->m_size);
  iVar2 = ::deLog2Floor32(*piVar5);
  piVar5 = tcu::Vector<int,_2>::y(&this->m_size);
  iVar3 = ::deLog2Floor32(*piVar5);
  iVar2 = de::max<int>(iVar2,iVar3);
  levelW = iVar2 + 1;
  for (levelH = 0; levelH < levelW; levelH = levelH + 1) {
    if (levelH == *(int *)&(this->super_Tex2DCompletenessCase).field_0x84) {
      piVar5 = tcu::Vector<int,_2>::x(&this->m_invalidLevelSize);
      local_294 = *piVar5;
    }
    else {
      piVar5 = tcu::Vector<int,_2>::x(&this->m_size);
      local_294 = de::max<int>(1,*piVar5 >> ((byte)levelH & 0x1f));
    }
    local_64 = local_294;
    if (levelH == *(int *)&(this->super_Tex2DCompletenessCase).field_0x84) {
      piVar5 = tcu::Vector<int,_2>::y(&this->m_invalidLevelSize);
      local_2b4 = *piVar5;
    }
    else {
      piVar5 = tcu::Vector<int,_2>::y(&this->m_size);
      local_2b4 = de::max<int>(1,*piVar5 >> ((byte)levelH & 0x1f));
    }
    local_68 = local_2b4;
    piVar5 = tcu::Vector<int,_2>::x(&this->m_size);
    iVar2 = *piVar5;
    piVar5 = tcu::Vector<int,_2>::y(&this->m_size);
    tcu::TextureLevel::setSize((TextureLevel *)&log,iVar2,*piVar5,1);
    tcu::TextureLevel::getAccess(&local_90,(TextureLevel *)&log);
    tcu::Vector<float,_4>::Vector(&local_a0,0.0,0.0,1.0,1.0);
    tcu::clear(&local_90,&local_a0);
    level = levelH;
    iVar3 = local_64;
    iVar2 = local_68;
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&stack0xffffffffffffff38,(TextureLevel *)&log)
    ;
    pixels = tcu::PixelBufferAccess::getDataPtr((PixelBufferAccess *)&stack0xffffffffffffff38);
    glwTexImage2D(0xde1,level,0x1908,iVar3,iVar2,0,0x1908,0x1401,pixels);
  }
  err = glwGetError();
  glu::checkError(err,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureCompletenessTests.cpp"
                  ,0x127);
  piVar5 = tcu::Vector<int,_2>::x(&this->m_size);
  dVar4 = ::deIsPowerOfTwo32(*piVar5);
  if (dVar4 == 0) {
    piVar5 = tcu::Vector<int,_2>::y(&this->m_size);
    dVar4 = ::deIsPowerOfTwo32(*piVar5);
    if (dVar4 == 0) {
      for (local_cc = 0; local_cc < 2; local_cc = local_cc + 1) {
        bVar1 = isExtensionSupported(this->m_ctxInfo,createTexture::s_relaxingExtensions[local_cc]);
        if (bVar1) {
          tcu::TestLog::operator<<(&local_250,local_48,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar6 = tcu::MessageBuilder::operator<<
                             (&local_250,createTexture::s_relaxingExtensions + local_cc);
          pMVar6 = tcu::MessageBuilder::operator<<
                             (pMVar6,(char (*) [48])
                                     " supported, assuming completeness test to pass.");
          tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_250);
          tcu::RGBA::RGBA(&local_254,0,0,0xff,0xff);
          (this->super_Tex2DCompletenessCase).m_compareColor.m_value = local_254.m_value;
          break;
        }
      }
    }
  }
  tcu::TextureLevel::~TextureLevel((TextureLevel *)&log);
  return;
}

Assistant:

void Incomplete2DSizeCase::createTexture (void)
{
	static const char* const s_relaxingExtensions[] =
	{
		"GL_OES_texture_npot",
		"GL_NV_texture_npot_2D_mipmap",
	};

	tcu::TextureFormat		fmt				= glu::mapGLTransferFormat(GL_RGBA, GL_UNSIGNED_BYTE);
	tcu::TextureLevel		levelData		(fmt);
	TestLog&				log				= m_testCtx.getLog();

	GLuint texture;
	glGenTextures	(1, &texture);
	glPixelStorei	(GL_UNPACK_ALIGNMENT, 1);
	glBindTexture	(GL_TEXTURE_2D, texture);

	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		GL_REPEAT);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		GL_REPEAT);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	GL_NEAREST_MIPMAP_NEAREST);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	GL_NEAREST);

	int numLevels = 1 + de::max(deLog2Floor32(m_size.x()), deLog2Floor32(m_size.y()));

	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		int	levelW = (levelNdx == m_invalidLevelNdx) ? m_invalidLevelSize.x() : de::max(1, m_size.x() >> levelNdx);
		int	levelH = (levelNdx == m_invalidLevelNdx) ? m_invalidLevelSize.y() : de::max(1, m_size.y() >> levelNdx);

		levelData.setSize(m_size.x(), m_size.y());
		clear(levelData.getAccess(), tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f));

		glTexImage2D(GL_TEXTURE_2D, levelNdx, GL_RGBA, levelW, levelH, 0, GL_RGBA, GL_UNSIGNED_BYTE, levelData.getAccess().getDataPtr());
	}

	GLU_CHECK_MSG("Set texturing state");

	// If size not allowed in core, search for relaxing extensions
	if (!deIsPowerOfTwo32(m_size.x()) && !deIsPowerOfTwo32(m_size.y()))
	{
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_relaxingExtensions); ++ndx)
		{
			if (isExtensionSupported(m_ctxInfo, s_relaxingExtensions[ndx]))
			{
				log << TestLog::Message << s_relaxingExtensions[ndx] << " supported, assuming completeness test to pass." << TestLog::EndMessage;
				m_compareColor = RGBA(0,0,255,255);
				break;
			}
		}
	}
}